

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

typed_option<unsigned_long> * __thiscall
VW::config::typed_option<unsigned_long>::default_value
          (typed_option<unsigned_long> *this,unsigned_long value)

{
  __shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  unsigned_long local_18;
  
  local_18 = value;
  std::make_shared<unsigned_long,unsigned_long&>((unsigned_long *)&_Stack_28);
  std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_default_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return this;
}

Assistant:

typed_option& default_value(T value)
  {
    m_default_value = std::make_shared<T>(value);
    return *this;
  }